

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O3

_Bool borg_spell(borg_spells spell)

{
  int *piVar1;
  short sVar2;
  borg_magic *pbVar3;
  _Bool _Var4;
  long lVar5;
  char *what;
  long lVar6;
  
  pbVar3 = borg_magics;
  if ((borg_magics != (borg_magic *)0x0) &&
     (lVar5 = (long)(player->class->magic).total_spells, 0 < lVar5)) {
    lVar6 = 0;
    do {
      if (*(borg_spells *)((long)&borg_magics->spell_enum + lVar6) == spell) {
        _Var4 = borg_spell_okay(spell);
        if (!_Var4) {
          return false;
        }
        sVar2 = borg.book_idx[*(int *)((long)&pbVar3->book + lVar6)];
        if (sVar2 < 0) {
          return false;
        }
        what = format("# Casting %s (%d,%d).",*(undefined8 *)((long)&pbVar3->name + lVar6),
                      (ulong)(uint)(int)sVar2,(ulong)*(uint *)((long)&pbVar3->book_offset + lVar6));
        borg_note(what);
        borg_keypress(0x6d);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)sVar2]);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                           [*(int *)((long)&pbVar3->book_offset + lVar6)]);
        piVar1 = (int *)((long)&pbVar3->times + lVar6);
        *piVar1 = *piVar1 + 1;
        return true;
      }
      lVar6 = lVar6 + 0x20;
    } while (lVar5 * 0x20 != lVar6);
  }
  return false;
}

Assistant:

bool borg_spell(const enum borg_spells spell)
{
    int i;

    int spell_num = borg_get_spell_number(spell);
    if (spell_num < 0)
        return false;

    borg_magic *as = &borg_magics[spell_num];

    /* Require ability (right now) */
    if (!borg_spell_okay(spell))
        return false;

    /* Look for the book */
    i = borg.book_idx[as->book];

    /* Paranoia */
    if (i < 0)
        return false;

    /* Debugging Info */
    borg_note(format("# Casting %s (%d,%d).", as->name, i, as->book_offset));

    /* Cast a spell */
    borg_keypress('m');
    borg_keypress(all_letters_nohjkl[i]);
    borg_keypress(all_letters_nohjkl[as->book_offset]);

    /* increment the spell counter */
    as->times++;

    /* Success */
    return true;
}